

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O3

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long *plVar5;
  long *extraout_RAX;
  char *in_RCX;
  char *pcVar6;
  undefined1 **address;
  int sock;
  int sock_00;
  int sock_01;
  int sock_02;
  int sock_03;
  int sock_04;
  int sock_05;
  int sock_06;
  int sock_07;
  int sock_08;
  int sock_09;
  int sock_10;
  int sock_11;
  int sock_12;
  int sock_13;
  int sock_14;
  int sock_15;
  int sock_16;
  int sock_17;
  int sock_18;
  int in_R8D;
  void *in_R9;
  int iVar7;
  uchar body [3];
  void *control;
  int val;
  nn_msghdr hdr;
  nn_iovec iovec;
  char buf [256];
  size_t in_stack_fffffffffffffe78;
  undefined1 local_17b [3];
  undefined8 local_178;
  char local_16c [4];
  undefined1 **local_168;
  undefined4 local_160;
  undefined8 *local_158;
  undefined8 local_150;
  undefined1 *local_148;
  undefined8 local_140;
  undefined1 local_138 [264];
  
  iVar1 = test_socket_impl((char *)0x34,1,0x10,(int)in_RCX);
  test_connect_impl((char *)0x35,iVar1,sock,in_RCX);
  iVar2 = test_socket_impl((char *)0x36,1,0x10,(int)in_RCX);
  test_bind_impl((char *)0x37,iVar2,sock_00,in_RCX);
  iVar3 = nn_bind(iVar1,"inproc://test");
  if (iVar3 < 0) {
    piVar4 = __errno_location();
    if (*piVar4 != 0x62) goto LAB_00101fed;
    iVar3 = 100;
    do {
      test_send_impl((char *)0x40,iVar1,0x10314b,in_RCX);
      test_recv_impl((char *)0x41,iVar2,0x10314b,in_RCX);
      test_send_impl((char *)0x42,iVar2,0x10314f,in_RCX);
      test_recv_impl((char *)0x43,iVar1,0x10314f,in_RCX);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    iVar3 = 100;
    do {
      test_send_impl((char *)0x48,iVar1,0x103154,in_RCX);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    iVar3 = 100;
    do {
      test_recv_impl((char *)0x4b,iVar2,0x103154,in_RCX);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    test_close_impl((char *)0x4e,iVar1,sock_01);
    iVar1 = (int)in_RCX;
    test_close_impl((char *)0x4f,iVar2,sock_02);
    iVar1 = test_socket_impl((char *)0x52,1,0x10,iVar1);
    pcVar6 = local_16c;
    local_16c[0] = -0x38;
    local_16c[1] = '\0';
    local_16c[2] = '\0';
    local_16c[3] = '\0';
    iVar3 = (int)pcVar6;
    test_setsockopt_impl((char *)0x54,iVar1,3,iVar3,in_R8D,in_R9,in_stack_fffffffffffffe78);
    test_bind_impl((char *)0x55,iVar1,sock_03,pcVar6);
    iVar2 = test_socket_impl((char *)0x56,1,0x10,(int)pcVar6);
    test_connect_impl((char *)0x57,iVar2,sock_04,pcVar6);
    local_16c[0] = -0x38;
    local_16c[1] = '\0';
    local_16c[2] = '\0';
    local_16c[3] = '\0';
    test_setsockopt_impl((char *)0x5a,iVar2,4,iVar3,in_R8D,in_R9,in_stack_fffffffffffffe78);
    iVar3 = nn_send(iVar2,"0123456789",10);
    if (iVar3 < 0) goto LAB_00102028;
    iVar7 = 0x14;
    do {
      if (iVar3 != 10) {
        main_cold_2();
        goto LAB_00101fed;
      }
      pcVar6 = (char *)0x0;
      iVar3 = nn_send(iVar2,"0123456789",10);
      iVar7 = iVar7 + -1;
    } while (-1 < iVar3);
    iVar3 = nn_errno();
    if (iVar3 != 0x6e) goto LAB_00102037;
    if (iVar7 == 0) {
      test_recv_impl((char *)0x65,iVar1,0x103158,pcVar6);
      test_send_impl((char *)0x66,iVar2,0x103158,pcVar6);
      pcVar6 = (char *)0x0;
      iVar3 = nn_send(iVar2,"0123456789",10);
      if (-1 < iVar3) goto LAB_00101ff2;
      iVar3 = nn_errno();
      if (iVar3 != 0x6e) goto LAB_00101ff2;
      iVar3 = 0x14;
      do {
        test_recv_impl((char *)0x6a,iVar1,0x103158,pcVar6);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      memset(local_138,0x41,0x100);
      iVar3 = nn_send(iVar2,local_138,0x100);
      if (iVar3 < 0) goto LAB_00101ff7;
      if (iVar3 != 0x100) goto LAB_00101fff;
      pcVar6 = (char *)0x0;
      iVar3 = nn_recv(iVar1,local_138,0x100);
      if (iVar3 < 0) goto LAB_00102004;
      if (iVar3 != 0x100) goto LAB_0010200c;
      test_close_impl((char *)0x78,iVar2,sock_05);
      test_close_impl((char *)0x79,iVar1,sock_06);
      iVar1 = test_socket_impl((char *)0x8a,2,0x31,(int)pcVar6);
      test_bind_impl((char *)0x8b,iVar1,sock_07,pcVar6);
      iVar2 = test_socket_impl((char *)0x8c,1,0x30,(int)pcVar6);
      test_connect_impl((char *)0x8d,iVar2,sock_08,pcVar6);
      test_send_impl((char *)0x8f,iVar2,0x10314b,pcVar6);
      local_148 = local_17b;
      address = &local_148;
      local_140 = 3;
      local_160 = 1;
      local_158 = &local_178;
      local_150 = 0xffffffffffffffff;
      local_168 = address;
      iVar3 = nn_recvmsg(iVar1,&local_168,0);
      if (iVar3 != 3) goto LAB_00102011;
      plVar5 = (long *)nn_cmsg_nxthdr_(&local_168,0);
      if (plVar5 != (long *)0x0) {
        do {
          if (((int)plVar5[1] == 1) && (*(int *)((long)plVar5 + 0xc) == 1)) goto LAB_00101dae;
          plVar5 = (long *)nn_cmsg_nxthdr_(&local_168,plVar5);
        } while (plVar5 != (long *)0x0);
      }
      main_cold_10();
      plVar5 = extraout_RAX;
LAB_00101dae:
      if (*plVar5 != 0x20) goto LAB_00102019;
      if ((char)plVar5[3] < '\0') goto LAB_0010201e;
      if (*(char *)((long)plVar5 + 0x1c) < '\0') {
        nn_freemsg(local_178);
        test_close_impl((char *)0xa8,iVar2,sock_09);
        test_close_impl((char *)0xa9,iVar1,sock_10);
        iVar1 = test_socket_impl((char *)0xac,1,0x70,(int)address);
        test_bind_impl((char *)0xad,iVar1,sock_11,(char *)address);
        iVar2 = test_socket_impl((char *)0xaf,1,0x70,(int)address);
        test_connect_impl((char *)0xb0,iVar2,sock_12,(char *)address);
        iVar3 = test_socket_impl((char *)0xb2,1,0x70,(int)address);
        test_connect_impl((char *)0xb3,iVar3,sock_13,(char *)address);
        test_close_impl((char *)0xb6,iVar1,sock_14);
        iVar7 = 100;
        nn_sleep(100);
        iVar1 = test_socket_impl((char *)0xbb,1,0x70,(int)address);
        test_bind_impl((char *)0xbc,iVar1,sock_15,(char *)address);
        do {
          test_send_impl((char *)0xc1,iVar2,0x10314b,(char *)address);
          test_send_impl((char *)0xc2,iVar3,0x10321b,(char *)address);
          test_recv_impl((char *)0xc3,iVar1,0x10314b,(char *)address);
          test_recv_impl((char *)0xc4,iVar1,0x10321b,(char *)address);
          test_send_impl((char *)0xc5,iVar1,0x10314f,(char *)address);
          test_recv_impl((char *)0xc6,iVar2,0x10314f,(char *)address);
          test_recv_impl((char *)0xc7,iVar3,0x10314f,(char *)address);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        iVar7 = 100;
        do {
          test_send_impl((char *)0xcc,iVar2,0x103154,(char *)address);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        iVar7 = 100;
        do {
          test_recv_impl((char *)0xcf,iVar1,0x103154,(char *)address);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        iVar7 = 100;
        do {
          test_send_impl((char *)0xd2,iVar3,0x10321f,(char *)address);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        iVar7 = 100;
        do {
          test_recv_impl((char *)0xd5,iVar1,0x10321f,(char *)address);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        test_close_impl((char *)0xd8,iVar3,sock_16);
        test_close_impl((char *)0xd9,iVar2,sock_17);
        test_close_impl((char *)0xda,iVar1,sock_18);
        return 0;
      }
      goto LAB_00102023;
    }
  }
  else {
LAB_00101fed:
    main_cold_1();
LAB_00101ff2:
    main_cold_3();
LAB_00101ff7:
    main_cold_12();
LAB_00101fff:
    main_cold_4();
LAB_00102004:
    main_cold_11();
LAB_0010200c:
    main_cold_5();
LAB_00102011:
    main_cold_6();
LAB_00102019:
    main_cold_7();
LAB_0010201e:
    main_cold_8();
LAB_00102023:
    main_cold_9();
LAB_00102028:
    iVar1 = nn_errno();
    if (iVar1 != 0x6e) goto LAB_00102037;
  }
  main_cold_14();
LAB_00102037:
  main_cold_13();
}

Assistant:

int main ()
{
    int rc;
    int sb;
    int sc;
    int s1, s2;
    int i;
    char buf [256];
    int val;
    struct nn_msghdr hdr;
    struct nn_iovec iovec;
    unsigned char body [3];
    void *control;
    struct nn_cmsghdr *cmsg;
    unsigned char *data;

    /*  Create a simple topology. */
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);

    /*  Try a duplicate bind. It should fail. */
    rc = nn_bind (sc, SOCKET_ADDRESS);
    nn_assert (rc < 0 && errno == EADDRINUSE);

    /*  Ping-pong test. */
    for (i = 0; i != 100; ++i) {

        test_send (sc, "ABC");
        test_recv (sb, "ABC");
        test_send (sb, "DEFG");
        test_recv (sc, "DEFG");
    }

    /*  Batch transfer test. */
    for (i = 0; i != 100; ++i) {
        test_send (sc, "XYZ");
    }
    for (i = 0; i != 100; ++i) {
        test_recv (sb, "XYZ");
    }

    test_close (sc);
    test_close (sb);

    /*  Test whether queue limits are observed. */
    sb = test_socket (AF_SP, NN_PAIR);
    val = 200;
    test_setsockopt (sb, NN_SOL_SOCKET, NN_RCVBUF, &val, sizeof (val));
    test_bind (sb, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);

    val = 200;
    test_setsockopt (sc, NN_SOL_SOCKET, NN_SNDTIMEO, &val, sizeof (val));
    i = 0;
    while (1) {
        rc = nn_send (sc, "0123456789", 10, 0);
        if (rc < 0 && nn_errno () == ETIMEDOUT)
            break;
        errno_assert (rc >= 0);
        nn_assert (rc == 10);
        ++i;
    }
    nn_assert (i == 20);
    test_recv (sb, "0123456789");
    test_send (sc, "0123456789");
    rc = nn_send (sc, "0123456789", 10, 0);
    nn_assert (rc < 0 && nn_errno () == ETIMEDOUT);
    for (i = 0; i != 20; ++i) {
        test_recv (sb, "0123456789");
    }

    /*  Make sure that even a message that doesn't fit into the buffers
        gets across. */
    for (i = 0; i != sizeof (buf); ++i)
        buf [i] = 'A';
    rc = nn_send (sc, buf, 256, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);
    rc = nn_recv (sb, buf, sizeof (buf), 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);

    test_close (sc);
    test_close (sb);

#if 0
    /*  Test whether connection rejection is handled decently. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    s1 = test_socket (AF_SP, NN_PAIR);
    test_connect (s1, SOCKET_ADDRESS);
    s2 = test_socket (AF_SP, NN_PAIR);
    test_connect (s2, SOCKET_ADDRESS);
    nn_sleep (100);
    test_close (s2);
    test_close (s1);
    test_close (sb);
#endif

    /* Check whether SP message header is transferred correctly. */
    sb = test_socket (AF_SP_RAW, NN_REP);
    test_bind (sb, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_REQ);
    test_connect (sc, SOCKET_ADDRESS);

    test_send (sc, "ABC");

    iovec.iov_base = body;
    iovec.iov_len = sizeof (body);
    hdr.msg_iov = &iovec;
    hdr.msg_iovlen = 1;
    hdr.msg_control = &control;
    hdr.msg_controllen = NN_MSG;
    rc = nn_recvmsg (sb, &hdr, 0);
    errno_assert (rc == 3);

    cmsg = NN_CMSG_FIRSTHDR (&hdr);
    while (1) {
        nn_assert (cmsg);
        if (cmsg->cmsg_level == PROTO_SP && cmsg->cmsg_type == SP_HDR)
            break;
        cmsg = NN_CMSG_NXTHDR (&hdr, cmsg);
    }
    nn_assert (cmsg->cmsg_len == NN_CMSG_SPACE (8+sizeof (size_t)));
    data = NN_CMSG_DATA (cmsg);
    nn_assert (!(data[0+sizeof (size_t)] & 0x80));
    nn_assert (data[4+sizeof (size_t)] & 0x80);

    nn_freemsg (control);

    test_close (sc);
    test_close (sb);

    /* Test binding a new socket after originally bound socket shuts down. */
    sb = test_socket (AF_SP, NN_BUS);
    test_bind (sb, SOCKET_ADDRESS);

    sc = test_socket (AF_SP, NN_BUS);
    test_connect (sc, SOCKET_ADDRESS);

    s1 = test_socket (AF_SP, NN_BUS);
    test_connect (s1, SOCKET_ADDRESS);

    /* Close bound socket, leaving connected sockets connect. */
    test_close (sb);

    nn_sleep (100);

    /* Rebind a new socket to the address to which our connected sockets are listening. */
    s2 = test_socket (AF_SP, NN_BUS);
    test_bind (s2, SOCKET_ADDRESS);

    /*  Ping-pong test. */
    for (i = 0; i != 100; ++i) {

        test_send (sc, "ABC");
        test_send (s1, "QRS");
        test_recv (s2, "ABC");
        test_recv (s2, "QRS");
        test_send (s2, "DEFG");
        test_recv (sc, "DEFG");
        test_recv (s1, "DEFG");
    }

    /*  Batch transfer test. */
    for (i = 0; i != 100; ++i) {
        test_send (sc, "XYZ");
    }
    for (i = 0; i != 100; ++i) {
        test_recv (s2, "XYZ");
    }
    for (i = 0; i != 100; ++i) {
        test_send (s1, "MNO");
    }
    for (i = 0; i != 100; ++i) {
        test_recv (s2, "MNO");
    }

    test_close (s1);
    test_close (sc);
    test_close (s2);

    return 0;
}